

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ResultClampingTestCase::testPolygonOffset
          (ResultClampingTestCase *this)

{
  ostringstream *poVar1;
  TextureFormat log;
  RenderContext *pRVar2;
  TestContext *testCtx;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  TestError *this_00;
  void *pvVar7;
  long lVar8;
  Surface referenceImage;
  Surface testImage;
  ProgramSources sources;
  ShaderProgram program;
  Surface local_358;
  Surface local_340;
  value_type local_328;
  value_type local_308;
  undefined1 local_2e8 [120];
  ios_base local_270 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_258;
  undefined1 local_238 [208];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ShaderProgram local_108;
  long lVar6;
  
  local_138 = 0x3f800000bf800000;
  uStack_130 = 0x3f8000003f800000;
  local_128 = 0x3f8000003f800000;
  uStack_120 = 0x3f8000003f800000;
  local_118 = 0xbf8000003f800000;
  uStack_110 = 0x3f8000003f800000;
  local_168 = 0xbf800000bf800000;
  uStack_160 = 0x3f800000bf800000;
  local_158 = 0x3f800000bf800000;
  uStack_150 = 0x3f800000bf800000;
  local_148 = 0xbf8000003f800000;
  uStack_140 = 0x3f800000bf800000;
  log = (TextureFormat)
        ((this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  iVar3 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_340,iVar3,iVar3);
  iVar3 = (this->super_PolygonOffsetTestCase).m_targetSize;
  tcu::Surface::Surface(&local_358,iVar3,iVar3);
  iVar3 = (*((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,"");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_308,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",""
            );
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_2e8,0,0xac);
  local_238._0_8_ = (pointer)0x0;
  local_238[8] = 0;
  local_238._9_7_ = 0;
  local_238[0x10] = 0;
  local_238._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e8,&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e8 + 0x18),&local_308);
  glu::ShaderProgram::ShaderProgram(&local_108,pRVar2,(ProgramSources *)local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_258);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e8 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  uVar4 = (**(code **)(lVar6 + 0x780))(local_108.m_program.m_program,"a_position");
  uVar5 = (**(code **)(lVar6 + 0x780))(local_108.m_program.m_program,"a_color");
  if (local_108.m_program.m_info.linkOk != false) {
    (**(code **)(lVar6 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar6 + 0x1d0))(0x3f800000);
    (**(code **)(lVar6 + 0x188))(0x4100);
    (**(code **)(lVar6 + 0x1a00))(0,0,(this->super_PolygonOffsetTestCase).m_targetSize);
    (**(code **)(lVar6 + 0x1680))(local_108.m_program.m_program);
    (**(code **)(lVar6 + 0x5e0))(0xb71);
    (**(code **)(lVar6 + 0x5e0))(0x8037);
    (**(code **)(lVar6 + 0x610))(uVar4);
    poVar1 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"POLYGON_OFFSET_FILL enabled.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0,&local_138);
    poVar1 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw bottom-right. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 8), Polygon Z = 1.0. (Result depth should clamp to 1.0)."
               ,0x86);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    (**(code **)(lVar6 + 0x4a0))(0x207);
    (**(code **)(lVar6 + 0x1028))(0,0x41000000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw bottom-right. Color = Red.\tState: DepthFunc = GREATER, PolygonOffset(0, 9), Polygon Z = 1.0. (Result depth should clamp to 1.0 too)"
               ,0x88);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    (**(code **)(lVar6 + 0x4a0))(0x204);
    (**(code **)(lVar6 + 0x1028))(0,0x41100000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0,0,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0,&local_168);
    poVar1 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw top-left. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, -8), Polygon Z = -1.0. (Result depth should clamp to -1.0)"
               ,0x84);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    (**(code **)(lVar6 + 0x4a0))(0x207);
    (**(code **)(lVar6 + 0x1028))(0,0xc1000000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0x3f800000,0x3f800000,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    poVar1 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Draw top-left. Color = Yellow.\tState: DepthFunc = LESS, PolygonOffset(0, -9), Polygon Z = -1.0. (Result depth should clamp to -1.0 too)."
               ,0x88);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    (**(code **)(lVar6 + 0x4a0))(0x201);
    (**(code **)(lVar6 + 0x1028))(0,0xc1100000);
    (**(code **)(lVar6 + 0x1858))(0x3f800000,0x3f800000,0,0x3f800000,uVar5);
    (**(code **)(lVar6 + 0x538))(4,0,3);
    (**(code **)(lVar6 + 0x518))(uVar4);
    (**(code **)(lVar6 + 0x1680))(0);
    (**(code **)(lVar6 + 0x648))();
    pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_328._M_dataplus._M_p = (pointer)0x300000008;
    pvVar7 = (void *)local_340.m_pixels.m_cap;
    if ((void *)local_340.m_pixels.m_cap != (void *)0x0) {
      pvVar7 = local_340.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2e8,(TextureFormat *)&local_328,local_340.m_width,
               local_340.m_height,1,pvVar7);
    glu::readPixels(pRVar2,0,0,(PixelBufferAccess *)local_2e8);
    glu::ShaderProgram::~ShaderProgram(&local_108);
    poVar1 = (ostringstream *)(local_2e8 + 8);
    local_2e8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Expecting: Top-left = White, Bottom-right = White.",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_270);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    pvVar7 = (void *)local_358.m_pixels.m_cap;
    if ((void *)local_358.m_pixels.m_cap != (void *)0x0) {
      pvVar7 = local_358.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2e8,(TextureFormat *)&local_108,local_358.m_width,
               local_358.m_height,1,pvVar7);
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x3f8000003f800000;
    tcu::clear((PixelBufferAccess *)local_2e8,(Vec4 *)&local_108);
    testCtx = (this->super_PolygonOffsetTestCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    pRVar2 = ((this->super_PolygonOffsetTestCase).super_TestCase.m_context)->m_renderCtx;
    local_108.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x300000008;
    if ((void *)local_340.m_pixels.m_cap != (void *)0x0) {
      local_340.m_pixels.m_cap = (size_t)local_340.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_2e8,(TextureFormat *)&local_108,local_340.m_width,
               local_340.m_height,1,(void *)local_340.m_pixels.m_cap);
    local_328._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_358.m_pixels.m_cap != (void *)0x0) {
      local_358.m_pixels.m_cap = (size_t)local_358.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_108,(TextureFormat *)&local_328,local_358.m_width,
               local_358.m_height,1,(void *)local_358.m_pixels.m_cap);
    verifyImages((TestLog *)log,testCtx,pRVar2,(ConstPixelBufferAccess *)local_2e8,
                 (ConstPixelBufferAccess *)&local_108);
    tcu::Surface::~Surface(&local_358);
    tcu::Surface::~Surface(&local_340);
    return;
  }
  glu::operator<<((TestLog *)log,&local_108);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compile failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPolygonOffsetTests.cpp"
             ,0x304);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ResultClampingTestCase::testPolygonOffset (void)
{
	using tcu::TestLog;

	const tcu::Vec4 triangleBottomRight[] =
	{
		tcu::Vec4(-1,  1,  1,  1),
		tcu::Vec4( 1,  1,  1,  1),
		tcu::Vec4( 1, -1,  1,  1),
	};
	const tcu::Vec4 triangleTopLeft[] =
	{
		tcu::Vec4(-1, -1, -1,  1),
		tcu::Vec4(-1,  1, -1,  1),
		tcu::Vec4( 1, -1, -1,  1),
	};

	tcu::TestLog&		log				= m_testCtx.getLog();
	tcu::Surface		testImage		(m_targetSize, m_targetSize);
	tcu::Surface		referenceImage	(m_targetSize, m_targetSize);

	// render test image
	{
		const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
		const glu::ShaderProgram	program		(m_context.getRenderContext(), glu::makeVtxFragSources(s_shaderSourceVertex, s_shaderSourceFragment));
		const GLint					positionLoc = gl.getAttribLocation(program.getProgram(), "a_position");
		const GLint					colorLoc	= gl.getAttribLocation(program.getProgram(), "a_color");

		if (!program.isOk())
		{
			log << program;
			TCU_FAIL("Shader compile failed.");
		}

		gl.clearColor				(0, 0, 0, 1);
		gl.clearDepthf				(1.0f);
		gl.clear					(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl.viewport					(0, 0, m_targetSize, m_targetSize);
		gl.useProgram				(program.getProgram());
		gl.enable					(GL_DEPTH_TEST);
		gl.enable					(GL_POLYGON_OFFSET_FILL);
		gl.enableVertexAttribArray	(positionLoc);

		log << TestLog::Message << "POLYGON_OFFSET_FILL enabled." << TestLog::EndMessage;

		//draw bottom right (far)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleBottomRight);

			log << TestLog::Message << "Draw bottom-right. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, 8), Polygon Z = 1.0. (Result depth should clamp to 1.0)." << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, 8);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw bottom-right. Color = Red.\tState: DepthFunc = GREATER, PolygonOffset(0, 9), Polygon Z = 1.0. (Result depth should clamp to 1.0 too)" << TestLog::EndMessage;

			gl.depthFunc				(GL_GREATER);
			gl.polygonOffset			(0, 9);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 0.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		//draw top left (near)
		{
			gl.vertexAttribPointer		(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, triangleTopLeft);

			log << TestLog::Message << "Draw top-left. Color = White.\tState: DepthFunc = ALWAYS, PolygonOffset(0, -8), Polygon Z = -1.0. (Result depth should clamp to -1.0)" << TestLog::EndMessage;

			gl.depthFunc				(GL_ALWAYS);
			gl.polygonOffset			(0, -8);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 1.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);

			log << TestLog::Message << "Draw top-left. Color = Yellow.\tState: DepthFunc = LESS, PolygonOffset(0, -9), Polygon Z = -1.0. (Result depth should clamp to -1.0 too)." << TestLog::EndMessage;

			gl.depthFunc				(GL_LESS);
			gl.polygonOffset			(0, -9);
			gl.vertexAttrib4f			(colorLoc, 1.0f, 1.0f, 0.0f, 1.0f);
			gl.drawArrays				(GL_TRIANGLES, 0, 3);
		}

		gl.disableVertexAttribArray	(positionLoc);
		gl.useProgram				(0);
		gl.finish					();

		glu::readPixels(m_context.getRenderContext(), 0, 0, testImage.getAccess());
	}

	// render reference image
	log << TestLog::Message << "Expecting: Top-left = White, Bottom-right = White." << TestLog::EndMessage;
	tcu::clear(referenceImage.getAccess(), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	// compare
	verifyImages(log, m_testCtx, m_context.getRenderContext(), testImage.getAccess(), referenceImage.getAccess());
}